

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.c
# Opt level: O1

void * threadTask(void *arg)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  adt_buf_err_t aVar4;
  int iVar5;
  rbf_data_t data;
  void *local_40;
  uint local_38;
  
  if (arg != (void *)0x0) {
    do {
      iVar5 = sem_wait((sem_t *)((long)arg + 0x10));
      if (iVar5 != 0) {
        threadTask_cold_1();
        return (void *)0x0;
      }
      pthread_spin_lock((pthread_spinlock_t *)((long)arg + 8));
      aVar4 = adt_rbfh_remove((adt_rbfh_t *)((long)arg + 0x30),(uint8_t *)&local_40);
      bVar3 = false;
      bVar1 = false;
      if (aVar4 == '\0') {
        if (local_40 == (void *)0x0) {
          bVar3 = false;
        }
        else {
          bVar3 = true;
          bVar1 = true;
          if (0x20 < (ulong)local_38) goto LAB_00122a3b;
          soa_free((soa_t *)((long)arg + 0x58),local_40,(ulong)local_38);
          bVar3 = true;
        }
        bVar1 = false;
      }
LAB_00122a3b:
      pthread_spin_unlock((pthread_spinlock_t *)((long)arg + 8));
      bVar2 = bVar3;
      if (bVar1) {
        free(local_40);
      }
      else {
        if (local_40 == (void *)0x0) {
          bVar2 = false;
        }
        if (aVar4 != '\0') {
          bVar2 = bVar3;
        }
      }
    } while (bVar2);
  }
  return (void *)0x0;
}

Assistant:

static THREAD_PROTO(threadTask,arg)
{
   if(arg!=0)
   {

      apx_allocator_t *self;
      uint32_t messages_processed=0;
      self = (apx_allocator_t*) arg;
      for(;;)
      {
#ifdef _MSC_VER
         DWORD result = WaitForSingleObject(self->semaphore, INFINITE);
         if (result == WAIT_OBJECT_0)
#else
         int result = sem_wait(&self->semaphore);
         if (result == 0)
#endif
         {
            bool processing_result;
            messages_processed++;
            processing_result = apx_allocator_processEvent(self);
            if (!processing_result)
            {
               break;
            }
         }
         else
         {
#ifdef _MSC_VER
            DWORD lastError = GetLastError();
            APX_LOG_ERROR("[APX_ALLOCATOR]: failure while waiting for semaphore, lastError=%d", lastError);
#else
            APX_LOG_ERROR("[APX_ALLOCATOR]: failure while waiting for semaphore, errno=%d", errno);
#endif
            break;
         }
      }
      //APX_LOG_DEBUG("[APX_ALLOCATOR]: messages_processed: %u\n", messages_processed);
   }
   THREAD_RETURN(0);
}